

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_spectral_pairs_digital_filter.cc
# Opt level: O1

bool __thiscall
sptk::LineSpectralPairsDigitalFilter::Run
          (LineSpectralPairsDigitalFilter *this,
          vector<double,_std::allocator<double>_> *filter_coefficients,double filter_input,
          double *filter_output,Buffer *buffer)

{
  int num;
  pointer pdVar1;
  double *pdVar2;
  pointer pdVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  pointer pdVar7;
  size_type sVar8;
  vector<double,_std::allocator<double>_> *this_00;
  double *pdVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  if (this->is_valid_ != true) {
    return false;
  }
  bVar4 = false;
  if (((buffer != (Buffer *)0x0) && (bVar4 = false, filter_output != (double *)0x0)) &&
     (sVar8 = (long)this->num_filter_order_ + 1, bVar4 = false,
     (long)(filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish -
     (long)(filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start >> 3 == sVar8)) {
    if ((long)(buffer->d1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->d1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != sVar8) {
      std::vector<double,_std::allocator<double>_>::resize(&buffer->d1_,sVar8);
      pdVar7 = (buffer->d1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar1 = (buffer->d1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pdVar7 != pdVar1) {
        memset(pdVar7,0,((long)pdVar1 + (-8 - (long)pdVar7) & 0xfffffffffffffff8U) + 8);
      }
    }
    sVar8 = (long)this->num_filter_order_ + 1;
    if ((long)(buffer->d2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->d2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != sVar8) {
      std::vector<double,_std::allocator<double>_>::resize(&buffer->d2_,sVar8);
      pdVar7 = (buffer->d2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar1 = (buffer->d2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pdVar7 != pdVar1) {
        memset(pdVar7,0,((long)pdVar1 + (-8 - (long)pdVar7) & 0xfffffffffffffff8U) + 8);
      }
    }
    this_00 = &buffer->ab_;
    if ((long)(buffer->ab_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->ab_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != (long)this->num_filter_order_) {
      std::vector<double,_std::allocator<double>_>::resize(this_00,(long)this->num_filter_order_);
    }
    pdVar9 = (filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar10 = filter_input * *pdVar9;
    if (this->num_filter_order_ == 0) {
      *filter_output = dVar10;
    }
    else {
      pdVar9 = pdVar9 + 1;
      pdVar2 = (filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pdVar9 != pdVar2) {
        pdVar7 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          dVar11 = cos(*pdVar9);
          *pdVar7 = dVar11 * -2.0;
          pdVar9 = pdVar9 + 1;
          pdVar7 = pdVar7 + 1;
        } while (pdVar9 != pdVar2);
      }
      pdVar7 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar1 = (buffer->d1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (buffer->d2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      num = this->num_filter_order_;
      dVar11 = *pdVar1;
      if (1 < (long)num) {
        dVar12 = *pdVar3;
        uVar5 = 1;
        do {
          pdVar1[uVar5] = pdVar7[uVar5 - 1] * dVar11 + pdVar1[uVar5];
          pdVar3[uVar5] = pdVar7[uVar5] * dVar12 + pdVar3[uVar5];
          pdVar1[uVar5 + 1] = dVar11 + pdVar1[uVar5 + 1];
          dVar12 = dVar12 + pdVar3[uVar5 + 1];
          pdVar3[uVar5 + 1] = dVar12;
          dVar11 = pdVar1[uVar5 + 1];
          dVar10 = dVar10 + pdVar1[uVar5] + pdVar3[uVar5];
          uVar5 = uVar5 + 2;
        } while (uVar5 < (ulong)(long)num);
      }
      bVar4 = IsEven(num);
      if (!bVar4) {
        lVar6 = (long)this->num_filter_order_;
        pdVar1[lVar6] = dVar11 * pdVar7[lVar6 + -1] + pdVar1[lVar6];
      }
      lVar6 = (long)this->num_filter_order_;
      dVar10 = dVar10 + (pdVar1[lVar6] - pdVar3[lVar6]);
      *filter_output = dVar10;
      if (0 < lVar6) {
        lVar6 = lVar6 + 1;
        do {
          pdVar1[lVar6 + -1] = pdVar1[lVar6 + -2];
          pdVar3[lVar6 + -1] = pdVar3[lVar6 + -2];
          lVar6 = lVar6 + -1;
        } while (1 < lVar6);
      }
      dVar10 = dVar10 * -0.5;
      *pdVar1 = dVar10;
      *pdVar3 = dVar10;
    }
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool LineSpectralPairsDigitalFilter::Run(
    const std::vector<double>& filter_coefficients, double filter_input,
    double* filter_output,
    LineSpectralPairsDigitalFilter::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ ||
      filter_coefficients.size() !=
          static_cast<std::size_t>(num_filter_order_ + 1) ||
      NULL == filter_output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (buffer->d1_.size() != static_cast<std::size_t>(num_filter_order_ + 1)) {
    buffer->d1_.resize(num_filter_order_ + 1);
    std::fill(buffer->d1_.begin(), buffer->d1_.end(), 0.0);
  }
  if (buffer->d2_.size() != static_cast<std::size_t>(num_filter_order_ + 1)) {
    buffer->d2_.resize(num_filter_order_ + 1);
    std::fill(buffer->d2_.begin(), buffer->d2_.end(), 0.0);
  }
  if (buffer->ab_.size() != static_cast<std::size_t>(num_filter_order_)) {
    buffer->ab_.resize(num_filter_order_);
  }

  const double gained_input(filter_input * filter_coefficients[0]);
  if (0 == num_filter_order_) {
    *filter_output = gained_input;
    return true;
  }

  std::transform(filter_coefficients.begin() + 1, filter_coefficients.end(),
                 buffer->ab_.begin(),
                 [](double w) { return -2.0 * std::cos(w); });

  const double* ab(&(buffer->ab_[0]));
  double* d1(&buffer->d1_[0]);
  double* d2(&buffer->d2_[0]);

  // Apply LSP synthesis filter.
  double sum(gained_input);
  {
    double x1(d1[0]);
    double x2(d2[0]);
    for (int i(1); i < num_filter_order_; i += 2) {
      d1[i] += x1 * ab[i - 1];
      d2[i] += x2 * ab[i];
      d1[i + 1] += x1;
      d2[i + 1] += x2;
      x1 = d1[i + 1];
      x2 = d2[i + 1];
      sum += d1[i] + d2[i];
    }
    if (!sptk::IsEven(num_filter_order_)) {
      d1[num_filter_order_] += x1 * ab[num_filter_order_ - 1];
    }
    sum += d1[num_filter_order_] - d2[num_filter_order_];
  }

  // Save result.
  *filter_output = sum;

  // Shift stored signals.
  for (int i(num_filter_order_); 0 < i; --i) {
    d1[i] = d1[i - 1];
    d2[i] = d2[i - 1];
  }
  const double delayed_output(-0.5 * sum);
  d1[0] = delayed_output;
  d2[0] = delayed_output;

  return true;
}